

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O0

bool isPrimeMillerRabin(BN *n,size_t k)

{
  bool bVar1;
  bool local_119;
  BN local_110;
  BN local_f8;
  BN local_e0;
  ulong local_c8;
  size_t j;
  undefined1 local_b8 [3];
  bool stop;
  undefined1 local_a0 [8];
  BN x;
  BN a;
  size_t i;
  undefined1 local_58 [8];
  BN t;
  size_t s;
  BN n1;
  size_t k_local;
  BN *n_local;
  
  n1.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)k;
  bVar1 = BN::isEven(n);
  if (bVar1) {
    n_local._7_1_ = 0;
  }
  else {
    BN::BN((BN *)&s,n);
    BN::operator--((BN *)&s);
    t.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)BN::countzeroright((BN *)&s);
    BN::operator>>((BN *)local_58,(BN *)&s,
                   (size_t)t.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    for (a.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        a.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <
        n1.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
        a.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)a.ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      BN::BN((BN *)&x.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,
             (uint64_t)
             (a.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 1));
      BN::PowMod((BN *)local_a0,
                 (BN *)&x.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(BN *)local_58,n);
      BN::bn1();
      bVar1 = BN::operator==((BN *)local_a0,(BN *)local_b8);
      local_119 = true;
      if (!bVar1) {
        local_119 = BN::operator==((BN *)local_a0,(BN *)&s);
      }
      BN::~BN((BN *)local_b8);
      if (local_119 == false) {
        j._3_1_ = 0;
        for (local_c8 = 0;
            (j._3_1_ & 1) == 0 &&
            local_c8 <
            (long)t.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage - 1U; local_c8 = local_c8 + 1) {
          BN::Qrt(&local_f8,(BN *)local_a0);
          BN::operator%(&local_e0,&local_f8,n);
          BN::operator=((BN *)local_a0,&local_e0);
          BN::~BN(&local_e0);
          BN::~BN(&local_f8);
          BN::bn1();
          bVar1 = BN::operator==((BN *)local_a0,&local_110);
          BN::~BN(&local_110);
          if (bVar1) {
            n_local._7_1_ = 0;
            j._4_4_ = 1;
            goto LAB_00118a67;
          }
          bVar1 = BN::operator==((BN *)local_a0,(BN *)&s);
          if (bVar1) {
            j._3_1_ = 1;
          }
        }
        if ((j._3_1_ & 1) == 0) {
          n_local._7_1_ = 0;
          j._4_4_ = 1;
        }
        else {
          j._4_4_ = 0;
        }
      }
      else {
        j._4_4_ = 4;
      }
LAB_00118a67:
      BN::~BN((BN *)local_a0);
      BN::~BN((BN *)&x.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((j._4_4_ != 0) && (j._4_4_ != 4)) goto LAB_00118ad3;
    }
    n_local._7_1_ = 1;
    j._4_4_ = 1;
LAB_00118ad3:
    BN::~BN((BN *)local_58);
    BN::~BN((BN *)&s);
  }
  return (bool)(n_local._7_1_ & 1);
}

Assistant:

bool isPrimeMillerRabin(const BN& n, size_t k) {
    if (n.isEven()) {
        return false;
    }
    BN n1(n);
    --n1;
    size_t s = n1.countzeroright();
    BN t = n1 >> s;
    for (size_t i = 0; i < k; ++i) {
        BN a(uint64_t(i + 2));
        BN x = a.PowMod(t, n);
        if (x == BN::bn1() || x == n1)
            continue;
        bool stop = false;
        for (size_t j = 0; !stop && j < s - 1; ++j) {
            x = x.Qrt() % n;
            if (x == BN::bn1())
                return false;
            if (x == n1)
                stop = true;
        }
        if (!stop)
            return false;
    }
    return true;
}